

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L.c
# Opt level: O2

void envy_bios_print_bit_L(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_bit_entry *peVar1;
  int iVar2;
  uint uVar3;
  uint idx;
  ulong uVar4;
  uint16_t addr;
  char *name;
  
  peVar1 = (bios->L).bit;
  if ((mask >> 0xe & 1) != 0 && peVar1 != (envy_bios_bit_entry *)0x0) {
    fprintf((FILE *)out,"BIT table \'L\' at 0x%x, version %i\n",(ulong)peVar1->offset,
            (ulong)peVar1->version);
    idx = 0;
    for (uVar3 = 0; peVar1 = (bios->L).bit, uVar3 < peVar1->t_len; uVar3 = uVar3 + 2) {
      iVar2 = bios_u16(bios,peVar1->t_offset + uVar3,&addr);
      if (addr != 0 && iVar2 == 0) {
        uVar4 = (ulong)addr;
        parse_at(bios,idx,&name);
        fprintf((FILE *)out,"0x%02x: 0x%x => L %s\n",(ulong)uVar3,uVar4,name);
      }
      idx = idx + 1;
    }
    fputc(10,(FILE *)out);
  }
  return;
}

Assistant:

void
envy_bios_print_bit_L(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_L *l = &bios->L;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!l->bit || !(mask & ENVY_BIOS_PRINT_L))
		return;

	fprintf(out, "BIT table 'L' at 0x%x, version %i\n",
		l->bit->offset, l->bit->version);

	for (i = 0; i * 2 < l->bit->t_len; ++i) {
		ret = bios_u16(bios, l->bit->t_offset + (i * 2), &addr);
		if (!ret && addr) {
			const char *name;
			ret = parse_at(bios, i, &name);
			fprintf(out, "0x%02x: 0x%x => L %s\n", i * 2, addr, name);
		}
	}

	fprintf(out, "\n");
}